

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O0

char * re2::utfrune(char *s,Rune c)

{
  int iVar1;
  int local_2c;
  int n;
  Rune r;
  long c1;
  byte *pbStack_18;
  Rune c_local;
  char *s_local;
  
  c1._4_4_ = c;
  pbStack_18 = (byte *)s;
  if (c < 0x80) {
    s_local = strchr(s,c);
  }
  else {
    while( true ) {
      for (; _n = (ulong)*pbStack_18, 0x7f < _n; pbStack_18 = pbStack_18 + iVar1) {
        iVar1 = chartorune(&local_2c,(char *)pbStack_18);
        if (local_2c == c1._4_4_) {
          return (char *)pbStack_18;
        }
      }
      if (_n == 0) {
        return (char *)0x0;
      }
      if (_n == (long)c1._4_4_) break;
      pbStack_18 = pbStack_18 + 1;
    }
    s_local = (char *)pbStack_18;
  }
  return s_local;
}

Assistant:

char*
utfrune(const char *s, Rune c)
{
	long c1;
	Rune r;
	int n;

	if(c < Runesync)		/* not part of utf sequence */
		return strchr((char*)s, c);

	for(;;) {
		c1 = *(unsigned char*)s;
		if(c1 < Runeself) {	/* one byte rune */
			if(c1 == 0)
				return 0;
			if(c1 == c)
				return (char*)s;
			s++;
			continue;
		}
		n = chartorune(&r, s);
		if(r == c)
			return (char*)s;
		s += n;
	}
	return 0;
}